

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O1

void __thiscall pstore::storage::shrink(storage *this,uint64_t new_size)

{
  pointer psVar1;
  element_type *peVar2;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  reference ptVar5;
  sat_entry *psVar6;
  sat_entry *psVar7;
  sat_entry *psVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  span<pstore::sat_entry,__1L> sp;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> local_68;
  span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> local_58;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_48;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_40;
  
  while (psVar1 = (this->regions_).
                  super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (this->regions_).
        super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar1) {
    peVar2 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar10 = peVar2->offset_;
    if (((uVar10 & 0x3fffff) != 0) || (uVar9 = peVar2->size_, (uVar9 & 0x3fffff) != 0)) {
      assert_failed("region->offset () % address::segment_size == 0 && region->size () % address::segment_size == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x58);
    }
    if (uVar10 < new_size) {
      _Var3._M_head_impl =
           (this->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      uVar9 = uVar9 + uVar10 >> 0x11;
      psVar6 = (sat_entry *)((long)(_Var3._M_head_impl)->_M_elems + uVar9);
      psVar7 = _Var3._M_head_impl[1]._M_elems;
      lVar11 = (long)(0x200000 - uVar9) >> 7;
      if (0 < lVar11) {
        psVar6 = (sat_entry *)((long)&psVar6->value + (0x200000 - uVar9 & 0xffffffffffffff80));
        lVar11 = lVar11 + 1;
        psVar8 = (sat_entry *)((long)(_Var3._M_head_impl)->_M_elems + uVar9 + 0x40);
        do {
          if (*(long *)&((memory_mapper_ptr *)((long)(psVar8 + 0xfffffffffffffffe) + 0x10))->
                        super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
              != 0 || *(long *)&psVar8[0xfffffffffffffffe].value != 0) {
            psVar8 = psVar8 + 0xfffffffffffffffe;
            goto LAB_0010ee1d;
          }
          if (*(long *)&((memory_mapper_ptr *)((long)(psVar8 + 0xffffffffffffffff) + 0x10))->
                        super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
              != 0 || *(long *)&psVar8[0xffffffffffffffff].value != 0) {
            psVar8 = psVar8 + 0xffffffffffffffff;
            goto LAB_0010ee1d;
          }
          if (*(long *)&(psVar8->region).
                        super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
              != 0 || *(long *)&psVar8->value != 0) goto LAB_0010ee1d;
          if (*(long *)&((memory_mapper_ptr *)((long)(psVar8 + 1) + 0x10))->
                        super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
              != 0 || *(long *)&psVar8[1].value != 0) {
            psVar8 = psVar8 + 1;
            goto LAB_0010ee1d;
          }
          lVar11 = lVar11 + -1;
          psVar8 = psVar8 + 4;
        } while (1 < lVar11);
      }
      lVar11 = (long)psVar7 - (long)psVar6 >> 5;
      if (lVar11 == 1) {
LAB_0010ee0e:
        psVar8 = psVar6;
        if (*(long *)&(psVar6->region).
                      super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> ==
            0 && *(long *)&psVar6->value == 0) {
          psVar8 = psVar7;
        }
      }
      else if (lVar11 == 2) {
LAB_0010ecb6:
        psVar8 = psVar6;
        if (*(long *)&(psVar6->region).
                      super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> ==
            0 && *(long *)&psVar6->value == 0) {
          psVar6 = psVar6 + 1;
          goto LAB_0010ee0e;
        }
      }
      else {
        psVar8 = psVar7;
        if ((lVar11 == 3) &&
           (psVar8 = psVar6,
           *(long *)&(psVar6->region).
                     super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> == 0
           && *(long *)&psVar6->value == 0)) {
          psVar6 = psVar6 + 1;
          goto LAB_0010ecb6;
        }
      }
LAB_0010ee1d:
      if (psVar8 != psVar7) {
        assert_failed("std::all_of (std::begin (*sat_) + region->end () / address::segment_size, std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0x5f);
      }
    }
    else {
      local_48._M_head_impl =
           (this->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      peVar2 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                 gsl::span<pstore::sat_entry,_65536L>::subspan
                           ((span<pstore::sat_entry,_65536L> *)&local_48,peVar2->offset_ >> 0x16,
                            peVar2->size_ >> 0x16);
      gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::span_iterator
                (&local_58,(span<pstore::sat_entry,__1L> *)&local_40,0);
      gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::span_iterator
                (&local_68,(span<pstore::sat_entry,__1L> *)&local_40,
                 local_40.super_extent_type<_1L>.size_);
      while ((local_58.span_ != local_68.span_ || (local_58.index_ != local_68.index_))) {
        ptVar5 = gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::
                 operator*(&local_58);
        if ((ptVar5->region).
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr) {
          assert_failed("segment.region == region",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                        ,0x67);
        }
        p_Var4 = (ptVar5->region).
                 super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (ptVar5->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        (ptVar5->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        p_Var4 = (ptVar5->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (ptVar5->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (ptVar5->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::operator++
                  (&local_58);
      }
      _Var3._M_head_impl =
           (this->sat_)._M_t.
           super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
      psVar6 = _Var3._M_head_impl[1]._M_elems;
      peVar2 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      psVar7 = (sat_entry *)((long)(_Var3._M_head_impl)->_M_elems + 0x40);
      uVar9 = 0x4001;
      do {
        if ((((memory_mapper_ptr *)((long)(psVar7 + 0xfffffffffffffffe) + 0x10))->
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            peVar2) {
          psVar8 = psVar7 + 0xfffffffffffffffe;
          break;
        }
        if ((((memory_mapper_ptr *)((long)(psVar7 + 0xffffffffffffffff) + 0x10))->
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            peVar2) {
          psVar8 = psVar7 + 0xffffffffffffffff;
          break;
        }
        psVar8 = psVar7;
        if ((psVar7->region).
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            peVar2) break;
        if ((((memory_mapper_ptr *)((long)(psVar7 + 1) + 0x10))->
            super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            peVar2) {
          psVar8 = psVar7 + 1;
          break;
        }
        uVar9 = uVar9 - 1;
        psVar7 = psVar7 + 4;
        psVar8 = psVar6;
      } while (1 < uVar9);
      if (psVar8 != psVar6) {
        assert_failed("std::all_of ( std::begin (*sat_), std::end (*sat_), [&region] (sat_entry const & segment) { return segment.region != region; })"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0x6e);
      }
      psVar1 = (this->regions_).
               super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->regions_).
      super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
      p_Var4 = psVar1[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
    }
    if (uVar10 < new_size) {
      return;
    }
  }
  _Var3._M_head_impl =
       (this->sat_)._M_t.
       super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  psVar6 = _Var3._M_head_impl[1]._M_elems;
  psVar7 = (sat_entry *)((long)(_Var3._M_head_impl)->_M_elems + 0x40);
  uVar10 = 0x4001;
  do {
    if (*(long *)&((memory_mapper_ptr *)((long)(psVar7 + 0xfffffffffffffffe) + 0x10))->
                  super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> != 0 ||
        *(long *)&psVar7[0xfffffffffffffffe].value != 0) {
      psVar8 = psVar7 + 0xfffffffffffffffe;
      break;
    }
    if (*(long *)&((memory_mapper_ptr *)((long)(psVar7 + 0xffffffffffffffff) + 0x10))->
                  super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> != 0 ||
        *(long *)&psVar7[0xffffffffffffffff].value != 0) {
      psVar8 = psVar7 + 0xffffffffffffffff;
      break;
    }
    psVar8 = psVar7;
    if (*(long *)&(psVar7->region).
                  super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> != 0 ||
        *(long *)&psVar7->value != 0) break;
    if (*(long *)&((memory_mapper_ptr *)((long)(psVar7 + 1) + 0x10))->
                  super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2> != 0 ||
        *(long *)&psVar7[1].value != 0) {
      psVar8 = psVar7 + 1;
      break;
    }
    uVar10 = uVar10 - 1;
    psVar7 = psVar7 + 4;
    psVar8 = psVar6;
  } while (1 < uVar10);
  if (psVar8 == psVar6) {
    return;
  }
  assert_failed("std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0x77);
}

Assistant:

void storage::shrink (std::uint64_t const new_size) {
        // We now look backwards through the regions, discarding segments and regions introduced
        // by this transaction
        while (!regions_.empty ()) {
            region::memory_mapper_ptr const & region = regions_.back ();
            PSTORE_ASSERT (region->offset () % address::segment_size == 0 &&
                           region->size () % address::segment_size == 0);
            if (region->offset () < new_size) {
                // Guarantee that segments beyond the mapped memory blocks are null.
                PSTORE_ASSERT (
                    std::all_of (std::begin (*sat_) + region->end () / address::segment_size,
                                 std::end (*sat_), [] (sat_entry const & s) {
                                     return s.value == nullptr && s.region == nullptr;
                                 }));
                return;
            }

            // Remove the entries in the segment address table.
            auto const sp = gsl::make_span (*sat_).subspan (
                region->offset () / address::segment_size, region->size () / address::segment_size);
            std::for_each (std::begin (sp), std::end (sp), [&region] (sat_entry & segment) {
                PSTORE_ASSERT (segment.region == region);
                segment.region = nullptr;
                segment.value = nullptr;
            });
            // Check that we caught every reference to this region.
            PSTORE_ASSERT (std::all_of (
                std::begin (*sat_), std::end (*sat_),
                [&region] (sat_entry const & segment) { return segment.region != region; }));

            // Remove the region itself.
            regions_.pop_back ();
        }

        // There are no mapped memory blocks. The segment address table should be all null.
        PSTORE_ASSERT (std::all_of (std::begin (*sat_), std::end (*sat_), [] (sat_entry const & s) {
            return s.value == nullptr && s.region == nullptr;
        }));
    }